

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O2

Amap_Cut_t * Amap_ManSetupPis(Amap_Man_t *p)

{
  Amap_Cut_t *pAVar1;
  uint *puVar2;
  Amap_Cut_t *pAVar3;
  long lVar4;
  
  pAVar1 = (Amap_Cut_t *)malloc((long)p->nObjs[2] << 3);
  pAVar3 = pAVar1;
  for (lVar4 = 0; lVar4 < p->vPis->nSize; lVar4 = lVar4 + 1) {
    puVar2 = (uint *)Vec_PtrEntry(p->vPis,(int)lVar4);
    *pAVar3 = (Amap_Cut_t)0x20000;
    pAVar3[1] = (Amap_Cut_t)(*puVar2 >> 2 & 0xfffffffe);
    *(Amap_Cut_t **)(puVar2 + 10) = pAVar3;
    puVar2[3] = 1;
    puVar2[0xc] = 0x3f800000;
    pAVar3 = pAVar3 + 2;
  }
  return pAVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates new cut and adds it to storage.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Amap_Cut_t * Amap_ManSetupPis( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    Amap_Cut_t * pCut;
    int i, nBytes = sizeof(Amap_Cut_t) + sizeof(int);
    char * pBuffer = ABC_ALLOC( char, Amap_ManPiNum(p) * nBytes );
    Amap_ManForEachPi( p, pObj, i )
    {
        pCut = (Amap_Cut_t *)( pBuffer + i*nBytes );
        pCut->iMat = 0;
        pCut->fInv = 0;
        pCut->nFans = 1;
        pCut->Fans[0] = Abc_Var2Lit( pObj->Id, 0 );
        pObj->pData = pCut;
        pObj->nCuts = 1;
        pObj->EstRefs = (float)1.0;
    }
    return (Amap_Cut_t *)pBuffer;
}